

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ActivationSoftplus * __thiscall
CoreML::Specification::ActivationParams::mutable_softplus(ActivationParams *this)

{
  ActivationLinear *this_00;
  
  if (this->_oneof_case_[0] == 0x46) {
    this_00 = (this->NonlinearityType_).linear_;
  }
  else {
    clear_NonlinearityType(this);
    this->_oneof_case_[0] = 0x46;
    this_00 = (ActivationLinear *)operator_new(0x18);
    ActivationSoftplus::ActivationSoftplus((ActivationSoftplus *)this_00);
    (this->NonlinearityType_).softplus_ = (ActivationSoftplus *)this_00;
  }
  return (ActivationSoftplus *)this_00;
}

Assistant:

inline ::CoreML::Specification::ActivationSoftplus* ActivationParams::mutable_softplus() {
  if (!has_softplus()) {
    clear_NonlinearityType();
    set_has_softplus();
    NonlinearityType_.softplus_ = new ::CoreML::Specification::ActivationSoftplus;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.softplus)
  return NonlinearityType_.softplus_;
}